

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int handle_certificate(ptls_t *tls,uint8_t *src,uint8_t *end,int *got_certs)

{
  st_ptls_on_extension_t *psVar1;
  st_ptls_verify_certificate_t *psVar2;
  ushort extid;
  ushort uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  char **ppcVar8;
  char *pcVar9;
  ushort *puVar10;
  ushort *puVar11;
  uint8_t *puVar12;
  ushort *puVar13;
  ushort *puVar14;
  ptls_iovec_t pVar15;
  st_ptls_extension_bitmap_t bitmap;
  ptls_iovec_t certs [16];
  st_ptls_extension_bitmap_t local_140;
  ptls_iovec_t local_138 [16];
  
  if (src != end) {
    if ((uint8_t *)(ulong)*src <= end + ~(ulong)src) {
      if (*src != 0) {
        return 0x2f;
      }
      if ((uint8_t *)0x2 < end + ~(ulong)src) {
        lVar7 = 1;
        uVar5 = 0;
        do {
          uVar5 = (ulong)src[lVar7] | uVar5 << 8;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        puVar14 = (ushort *)(src + 4);
        if (uVar5 <= (ulong)((long)end - (long)puVar14)) {
          if (uVar5 == 0) {
            uVar5 = 0;
            puVar10 = puVar14;
          }
          else {
            puVar10 = (ushort *)(src + uVar5 + 4);
            uVar5 = 0;
            do {
              if ((ulong)((long)puVar10 - (long)puVar14) < 3) {
                return 0x32;
              }
              lVar7 = 0;
              uVar6 = 0;
              do {
                uVar6 = (ulong)*(byte *)((long)puVar14 + lVar7) | uVar6 << 8;
                lVar7 = lVar7 + 1;
              } while (lVar7 != 3);
              puVar12 = (uint8_t *)((long)puVar14 + 3);
              if ((ulong)((long)puVar10 - (long)puVar12) < uVar6) {
                return 0x32;
              }
              if (uVar5 < 0x10) {
                local_138[uVar5].base = puVar12;
                local_138[uVar5].len = uVar6;
                uVar5 = uVar5 + 1;
              }
              puVar13 = (ushort *)(puVar12 + uVar6);
              local_140.bits = 0;
              if ((ulong)((long)puVar10 - (long)puVar13) < 2) {
                return 0x32;
              }
              puVar11 = puVar13 + 1;
              uVar6 = (ulong)(ushort)(*puVar13 << 8 | *puVar13 >> 8);
              if ((ulong)((long)puVar10 - (long)puVar11) < uVar6) {
                return 0x32;
              }
              puVar14 = puVar11;
              if (uVar6 != 0) {
                puVar14 = (ushort *)((long)puVar13 + uVar6 + 2);
                do {
                  if ((long)puVar14 - (long)puVar11 < 2) {
                    return 0x32;
                  }
                  extid = *puVar11 << 8 | *puVar11 >> 8;
                  iVar4 = extension_bitmap_testandset(&local_140,0xb,extid);
                  if (iVar4 == 0) {
                    return 0x2f;
                  }
                  if (((long)puVar14 - (long)puVar11) - 2U < 2) {
                    return 0x32;
                  }
                  uVar3 = puVar11[1] << 8 | puVar11[1] >> 8;
                  puVar11 = puVar11 + 2;
                  if ((ulong)((long)puVar14 - (long)puVar11) < (ulong)uVar3) {
                    return 0x32;
                  }
                  psVar1 = tls->ctx->on_extension;
                  if ((psVar1 != (st_ptls_on_extension_t *)0x0) &&
                     (pVar15.len._0_2_ = uVar3, pVar15.base = (uint8_t *)puVar11,
                     pVar15.len._2_6_ = 0, iVar4 = (*psVar1->cb)(psVar1,tls,'\v',extid,pVar15),
                     iVar4 != 0)) {
                    return 1;
                  }
                  puVar11 = (ushort *)((long)puVar11 + (ulong)uVar3);
                } while (puVar11 != puVar14);
              }
            } while (puVar14 != puVar10);
          }
          if (puVar10 != (ushort *)end) {
            return 0x32;
          }
          psVar2 = tls->ctx->verify_certificate;
          if (psVar2 != (st_ptls_verify_certificate_t *)0x0) {
            if ((tls->field_0x1e8 & 1) == 0) {
              ppcVar8 = &tls->server_name;
              if ((undefined1  [112])((undefined1  [112])tls->ech & (undefined1  [112])0x5) ==
                  (undefined1  [112])0x1) {
                ppcVar8 = &(tls->ech).client.public_name;
              }
              pcVar9 = *ppcVar8;
            }
            else {
              pcVar9 = (char *)0x0;
            }
            iVar4 = (*psVar2->cb)(psVar2,tls,pcVar9,&(tls->certificate_verify).cb,
                                  &(tls->certificate_verify).verify_ctx,local_138,uVar5);
            if (iVar4 != 0) {
              return iVar4;
            }
          }
          *got_certs = (uint)(uVar5 != 0);
          return 0;
        }
      }
    }
  }
  return 0x32;
}

Assistant:

static int handle_certificate(ptls_t *tls, const uint8_t *src, const uint8_t *end, int *got_certs)
{
    ptls_iovec_t certs[16];
    size_t num_certs = 0;
    int ret = 0;

    /* certificate request context */
    ptls_decode_open_block(src, end, 1, {
        if (src != end) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    });
    /* certificate_list */
    ptls_decode_block(src, end, 3, {
        while (src != end) {
            ptls_decode_open_block(src, end, 3, {
                if (num_certs < PTLS_ELEMENTSOF(certs))
                    certs[num_certs++] = ptls_iovec_init(src, end - src);
                src = end;
            });
            uint16_t type;
            decode_open_extensions(src, end, PTLS_HANDSHAKE_TYPE_CERTIFICATE, &type, {
                if (tls->ctx->on_extension != NULL &&
                    (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_CERTIFICATE, type,
                                                      ptls_iovec_init(src, end - src)) != 0))
                    goto Exit;
                src = end;
            });
        }
    });

    if (tls->ctx->verify_certificate != NULL) {
        const char *server_name = NULL;
        if (!ptls_is_server(tls)) {
            if (tls->ech.offered && !ptls_is_ech_handshake(tls, NULL, NULL, NULL)) {
                server_name = tls->ech.client.public_name;
            } else {
                server_name = tls->server_name;
            }
        }
        if ((ret = tls->ctx->verify_certificate->cb(tls->ctx->verify_certificate, tls, server_name, &tls->certificate_verify.cb,
                                                    &tls->certificate_verify.verify_ctx, certs, num_certs)) != 0)
            goto Exit;
    }

    *got_certs = num_certs != 0;

Exit:
    return ret;
}